

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFabricPortGetThroughput
          (zes_fabric_port_handle_t hPort,zes_fabric_port_throughput_t *pThroughput)

{
  zes_pfnFabricPortGetThroughput_t pfnGetThroughput;
  ze_result_t result;
  zes_fabric_port_throughput_t *pThroughput_local;
  zes_fabric_port_handle_t hPort_local;
  
  pfnGetThroughput._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd38 != (code *)0x0) {
    pfnGetThroughput._4_4_ = (*DAT_0011cd38)(hPort,pThroughput);
  }
  return pfnGetThroughput._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetThroughput(
        zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
        zes_fabric_port_throughput_t* pThroughput       ///< [in,out] Will contain the Fabric port throughput counters.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetThroughput = context.zesDdiTable.FabricPort.pfnGetThroughput;
        if( nullptr != pfnGetThroughput )
        {
            result = pfnGetThroughput( hPort, pThroughput );
        }
        else
        {
            // generic implementation
        }

        return result;
    }